

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cli.c
# Opt level: O1

int ssl_parse_server_key_exchange(mbedtls_ssl_context *ssl)

{
  ushort *buf;
  mbedtls_key_exchange_type_t mVar1;
  mbedtls_ssl_ciphersuite_t *info;
  mbedtls_x509_crt *pmVar2;
  uchar *puVar3;
  mbedtls_pk_type_t mVar4;
  byte bVar5;
  int iVar6;
  mbedtls_pk_type_t mVar7;
  uint ret;
  uint ret_00;
  ulong uVar8;
  mbedtls_md_info_t *pmVar9;
  size_t len;
  int line;
  uchar *input;
  char *text;
  ushort *puVar10;
  size_t sVar11;
  mbedtls_md_type_t md_type;
  ushort *end;
  uchar *p;
  mbedtls_pk_type_t pk_alg;
  mbedtls_md_type_t md_alg;
  uchar hash [64];
  mbedtls_md_context_t ctx;
  mbedtls_md5_context mbedtls_md5;
  ushort *local_140;
  mbedtls_pk_type_t local_138;
  mbedtls_md_type_t local_134;
  ushort *local_130;
  uchar local_128 [16];
  uchar local_118 [48];
  mbedtls_sha1_context local_e8;
  mbedtls_md5_context local_88;
  
  info = ssl->transform_negotiate->ciphersuite_info;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
             ,0x7ef,"=> parse server key exchange");
  if (info->key_exchange - MBEDTLS_KEY_EXCHANGE_ECDH_RSA < 2) {
    pmVar2 = ssl->session_negotiate->peer_cert;
    if (pmVar2 == (mbedtls_x509_crt *)0x0) {
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0x7ca,"certificate required");
      iVar6 = -0x7700;
    }
    else {
      iVar6 = mbedtls_pk_can_do(&pmVar2->pk,MBEDTLS_PK_ECKEY);
      if (iVar6 == 0) {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                   ,0x7d1,"server key not ECDH capable");
        iVar6 = -0x6d00;
      }
      else {
        iVar6 = mbedtls_ecdh_get_params
                          (&ssl->handshake->ecdh_ctx,
                           (mbedtls_ecp_keypair *)(ssl->session_negotiate->peer_cert->pk).pk_ctx,
                           MBEDTLS_ECDH_THEIRS);
        if (iVar6 == 0) {
          iVar6 = ssl_check_server_ecdh_params(ssl);
          if (iVar6 == 0) {
            iVar6 = 0;
          }
          else {
            mbedtls_debug_print_msg
                      (ssl,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                       ,0x7e0,"bad server certificate (ECDH curve)");
            iVar6 = -0x7a00;
          }
        }
        else {
          mbedtls_debug_print_ret
                    (ssl,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                     ,0x7da,"mbedtls_ecdh_get_params",iVar6);
        }
      }
    }
    if (iVar6 != 0) {
      text = "ssl_get_ecdh_params_from_cert";
      line = 0x803;
LAB_001b2433:
      mbedtls_debug_print_ret
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,line,text,iVar6);
      return iVar6;
    }
    iVar6 = 0x807;
LAB_001b2453:
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,iVar6,"<= skip parse server key exchange");
    ssl->state = ssl->state + 1;
    return 0;
  }
  if (info->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA) {
    iVar6 = 0x7f4;
    goto LAB_001b2453;
  }
  iVar6 = mbedtls_ssl_read_record(ssl);
  if (iVar6 != 0) {
    text = "mbedtls_ssl_read_record";
    line = 0x812;
    goto LAB_001b2433;
  }
  if (ssl->in_msgtype != 0x16) {
    iVar6 = 0x818;
LAB_001b2404:
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,iVar6,"bad server key exchange message");
    return -0x7700;
  }
  puVar3 = ssl->in_msg;
  if (*puVar3 != '\f') {
    if ((info->key_exchange | MBEDTLS_KEY_EXCHANGE_DHE_RSA) != MBEDTLS_KEY_EXCHANGE_RSA_PSK) {
      iVar6 = 0x829;
      goto LAB_001b2404;
    }
    ssl->record_read = 1;
    goto LAB_001b2797;
  }
  uVar8 = (ulong)(*(uint *)&ssl->conf->field_0x164 & 2);
  local_140 = (ushort *)(puVar3 + uVar8 * 4 + 4);
  end = (ushort *)(puVar3 + ssl->in_hslen);
  mbedtls_debug_print_buf
            (ssl,3,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
             ,0x82f,"server key exchange",(uchar *)local_140,ssl->in_hslen - (uVar8 * 4 + 4));
  if (info->key_exchange - MBEDTLS_KEY_EXCHANGE_PSK < 4) {
    puVar10 = local_140 + 1;
    local_140 = (ushort *)((long)local_140 + (ulong)(ushort)(*local_140 << 8 | *local_140 >> 8) + 2)
    ;
    if (end < local_140) {
      local_140 = puVar10;
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0x72a,"bad server key exchange message (psk_identity_hint length)");
      iVar6 = 0x839;
      goto LAB_001b258d;
    }
  }
  mVar1 = info->key_exchange;
  if (MBEDTLS_KEY_EXCHANGE_ECDHE_PSK < mVar1) {
LAB_001b2501:
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0x867,"should never happen");
    return -0x6c00;
  }
  if ((0x118U >> (mVar1 & 0x1f) & 1) == 0) {
    if ((0x44U >> (mVar1 & 0x1f) & 1) == 0) {
      if ((0xa0U >> (mVar1 & 0x1f) & 1) == 0) goto LAB_001b2501;
    }
    else {
      iVar6 = ssl_parse_server_dh_params(ssl,(uchar **)&local_140,(uchar *)end);
      if (iVar6 != 0) {
        iVar6 = 0x84e;
        goto LAB_001b258d;
      }
    }
  }
  else {
    iVar6 = ssl_parse_server_ecdh_params(ssl,(uchar **)&local_140,(uchar *)end);
    if (iVar6 != 0) {
      iVar6 = 0x85e;
LAB_001b258d:
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,iVar6,"bad server key exchange message");
      return -0x7b00;
    }
  }
  puVar10 = local_140;
  if (2 < info->key_exchange - MBEDTLS_KEY_EXCHANGE_DHE_RSA) goto LAB_001b2797;
  local_134 = MBEDTLS_MD_NONE;
  local_138 = MBEDTLS_PK_NONE;
  puVar3 = ssl->in_msg;
  bVar5 = ssl->conf->field_0x164;
  if (ssl->minor_ver == 3) {
    iVar6 = ssl_parse_signature_algorithm
                      (ssl,(uchar **)&local_140,(uchar *)end,&local_134,&local_138);
    mVar4 = local_138;
    if (iVar6 == 0) {
      local_130 = puVar10;
      mVar7 = mbedtls_ssl_get_ciphersuite_sig_pk_alg(info);
      puVar10 = local_130;
      if (mVar4 == mVar7) goto LAB_001b2683;
      iVar6 = 0x888;
    }
    else {
      iVar6 = 0x882;
    }
LAB_001b2782:
    sVar11 = 0;
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,iVar6,"bad server key exchange message");
    ret = 0xffff8500;
  }
  else if (ssl->minor_ver < 3) {
    local_138 = mbedtls_ssl_get_ciphersuite_sig_pk_alg(info);
    if (local_138 == MBEDTLS_PK_ECDSA) {
      local_134 = MBEDTLS_MD_SHA1;
    }
LAB_001b2683:
    uVar8 = (ulong)(ushort)(*local_140 << 8 | *local_140 >> 8);
    buf = local_140 + 1;
    if (end != (ushort *)((long)local_140 + uVar8 + 2)) {
      iVar6 = 0x8a7;
      local_140 = buf;
      goto LAB_001b2782;
    }
    puVar3 = puVar3 + (ulong)((bVar5 & 2) >> 1) * 8 + 4;
    sVar11 = (long)puVar10 - (long)puVar3;
    local_140 = buf;
    mbedtls_debug_print_buf
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0x8ab,"signature",(uchar *)buf,uVar8);
    md_type = local_134;
    if (local_134 == MBEDTLS_MD_NONE) {
      mbedtls_md5_init(&local_88);
      mbedtls_sha1_init(&local_e8);
      local_130 = (ushort *)((ulong)local_130 & 0xffffffff00000000);
      mbedtls_md5_starts(&local_88);
      mbedtls_md5_update(&local_88,ssl->handshake->randbytes,0x40);
      mbedtls_md5_update(&local_88,puVar3,sVar11);
      mbedtls_md5_finish(&local_88,local_128);
      mbedtls_sha1_starts(&local_e8);
      input = ssl->handshake->randbytes;
      mbedtls_sha1_update(&local_e8,input,0x40);
      mbedtls_sha1_update(&local_e8,puVar3,sVar11);
      mbedtls_sha1_finish(&local_e8,local_118);
      md_type = (mbedtls_md_type_t)local_130;
      mbedtls_md5_free(&local_88);
      mbedtls_sha1_free(&local_e8);
      sVar11 = 0x24;
    }
    else {
      mbedtls_md_init((mbedtls_md_context_t *)&local_e8);
      pmVar9 = mbedtls_md_info_from_type(md_type);
      ret = mbedtls_md_setup((mbedtls_md_context_t *)&local_e8,pmVar9,0);
      input = (uchar *)(ulong)ret;
      if (ret == 0) {
        mbedtls_md_starts((mbedtls_md_context_t *)&local_e8);
        mbedtls_md_update((mbedtls_md_context_t *)&local_e8,ssl->handshake->randbytes,0x40);
        mbedtls_md_update((mbedtls_md_context_t *)&local_e8,puVar3,sVar11);
        mbedtls_md_finish((mbedtls_md_context_t *)&local_e8,local_128);
        mbedtls_md_free((mbedtls_md_context_t *)&local_e8);
      }
      else {
        mbedtls_debug_print_ret
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                   ,0x8ee,"mbedtls_md_setup",ret);
      }
      sVar11 = 0;
      if (ret != 0) goto LAB_001b278e;
    }
    ret = (uint)input;
    len = sVar11;
    if (md_type != MBEDTLS_MD_NONE) {
      pmVar9 = mbedtls_md_info_from_type(md_type);
      bVar5 = mbedtls_md_get_size(pmVar9);
      len = (size_t)bVar5;
    }
    mbedtls_debug_print_buf
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0x901,"parameters hash",local_128,len);
    pmVar2 = ssl->session_negotiate->peer_cert;
    if (pmVar2 == (mbedtls_x509_crt *)0x0) {
      sVar11 = 0;
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0x905,"certificate required");
      ret = 0xffff8900;
    }
    else {
      iVar6 = mbedtls_pk_can_do(&pmVar2->pk,local_138);
      if (iVar6 == 0) {
        sVar11 = 0;
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                   ,0x90e,"bad server key exchange message");
        ret = 0xffff9300;
      }
      else {
        ret_00 = mbedtls_pk_verify(&ssl->session_negotiate->peer_cert->pk,md_type,local_128,sVar11,
                                   (uchar *)local_140,uVar8);
        if (ret_00 == 0) {
          sVar11 = 1;
        }
        else {
          mbedtls_debug_print_ret
                    (ssl,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                     ,0x915,"mbedtls_pk_verify",ret_00);
          sVar11 = 0;
          ret = ret_00;
        }
      }
    }
  }
  else {
    sVar11 = 0;
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0x89b,"should never happen");
    ret = 0xffff9400;
  }
LAB_001b278e:
  if ((char)sVar11 == '\0') {
    return ret;
  }
LAB_001b2797:
  ssl->state = ssl->state + 1;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
             ,0x920,"<= parse server key exchange");
  return 0;
}

Assistant:

static int ssl_parse_server_key_exchange( mbedtls_ssl_context *ssl )
{
    int ret;
    const mbedtls_ssl_ciphersuite_t *ciphersuite_info = ssl->transform_negotiate->ciphersuite_info;
    unsigned char *p, *end;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> parse server key exchange" ) );

#if defined(MBEDTLS_KEY_EXCHANGE_RSA_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= skip parse server key exchange" ) );
        ssl->state++;
        return( 0 );
    }
    ((void) p);
    ((void) end);
#endif

#if defined(MBEDTLS_KEY_EXCHANGE_ECDH_RSA_ENABLED) || \
    defined(MBEDTLS_KEY_EXCHANGE_ECDH_ECDSA_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDH_RSA ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDH_ECDSA )
    {
        if( ( ret = ssl_get_ecdh_params_from_cert( ssl ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "ssl_get_ecdh_params_from_cert", ret );
            return( ret );
        }

        MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= skip parse server key exchange" ) );
        ssl->state++;
        return( 0 );
    }
    ((void) p);
    ((void) end);
#endif /* MBEDTLS_KEY_EXCHANGE_ECDH_RSA_ENABLED ||
          MBEDTLS_KEY_EXCHANGE_ECDH_ECDSA_ENABLED */

    if( ( ret = mbedtls_ssl_read_record( ssl ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_read_record", ret );
        return( ret );
    }

    if( ssl->in_msgtype != MBEDTLS_SSL_MSG_HANDSHAKE )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server key exchange message" ) );
        return( MBEDTLS_ERR_SSL_UNEXPECTED_MESSAGE );
    }

    /*
     * ServerKeyExchange may be skipped with PSK and RSA-PSK when the server
     * doesn't use a psk_identity_hint
     */
    if( ssl->in_msg[0] != MBEDTLS_SSL_HS_SERVER_KEY_EXCHANGE )
    {
        if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_PSK ||
            ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA_PSK )
        {
            ssl->record_read = 1;
            goto exit;
        }

        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server key exchange message" ) );
        return( MBEDTLS_ERR_SSL_UNEXPECTED_MESSAGE );
    }

    p   = ssl->in_msg + mbedtls_ssl_hs_hdr_len( ssl );
    end = ssl->in_msg + ssl->in_hslen;
    MBEDTLS_SSL_DEBUG_BUF( 3,   "server key exchange", p, end - p );

#if defined(MBEDTLS_KEY_EXCHANGE__SOME__PSK_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_PSK )
    {
        if( ssl_parse_server_psk_hint( ssl, &p, end ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server key exchange message" ) );
            return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_KEY_EXCHANGE );
        }
    } /* FALLTROUGH */
#endif /* MBEDTLS_KEY_EXCHANGE__SOME__PSK_ENABLED */

#if defined(MBEDTLS_KEY_EXCHANGE_PSK_ENABLED) ||                       \
    defined(MBEDTLS_KEY_EXCHANGE_RSA_PSK_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA_PSK )
        ; /* nothing more to do */
    else
#endif /* MBEDTLS_KEY_EXCHANGE_PSK_ENABLED ||
          MBEDTLS_KEY_EXCHANGE_RSA_PSK_ENABLED */
#if defined(MBEDTLS_KEY_EXCHANGE_DHE_RSA_ENABLED) ||                       \
    defined(MBEDTLS_KEY_EXCHANGE_DHE_PSK_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_RSA ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_PSK )
    {
        if( ssl_parse_server_dh_params( ssl, &p, end ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server key exchange message" ) );
            return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_KEY_EXCHANGE );
        }
    }
    else
#endif /* MBEDTLS_KEY_EXCHANGE_DHE_RSA_ENABLED ||
          MBEDTLS_KEY_EXCHANGE_DHE_PSK_ENABLED */
#if defined(MBEDTLS_KEY_EXCHANGE_ECDHE_RSA_ENABLED) ||                     \
    defined(MBEDTLS_KEY_EXCHANGE_ECDHE_PSK_ENABLED) ||                     \
    defined(MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_RSA ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA )
    {
        if( ssl_parse_server_ecdh_params( ssl, &p, end ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server key exchange message" ) );
            return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_KEY_EXCHANGE );
        }
    }
    else
#endif /* MBEDTLS_KEY_EXCHANGE_ECDHE_RSA_ENABLED ||
          MBEDTLS_KEY_EXCHANGE_ECDHE_PSK_ENABLED ||
          MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA_ENABLED */
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
        return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
    }

#if defined(MBEDTLS_KEY_EXCHANGE_DHE_RSA_ENABLED) ||                       \
    defined(MBEDTLS_KEY_EXCHANGE_ECDHE_RSA_ENABLED) ||                     \
    defined(MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_RSA ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_RSA ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA )
    {
        size_t sig_len, hashlen;
        unsigned char hash[64];
        mbedtls_md_type_t md_alg = MBEDTLS_MD_NONE;
        mbedtls_pk_type_t pk_alg = MBEDTLS_PK_NONE;
        unsigned char *params = ssl->in_msg + mbedtls_ssl_hs_hdr_len( ssl );
        size_t params_len = p - params;

        /*
         * Handle the digitally-signed structure
         */
#if defined(MBEDTLS_SSL_PROTO_TLS1_2)
        if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_3 )
        {
            if( ssl_parse_signature_algorithm( ssl, &p, end,
                                               &md_alg, &pk_alg ) != 0 )
            {
                MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server key exchange message" ) );
                return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_KEY_EXCHANGE );
            }

            if( pk_alg != mbedtls_ssl_get_ciphersuite_sig_pk_alg( ciphersuite_info ) )
            {
                MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server key exchange message" ) );
                return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_KEY_EXCHANGE );
            }
        }
        else
#endif /* MBEDTLS_SSL_PROTO_TLS1_2 */
#if defined(MBEDTLS_SSL_PROTO_SSL3) || defined(MBEDTLS_SSL_PROTO_TLS1) || \
    defined(MBEDTLS_SSL_PROTO_TLS1_1)
        if( ssl->minor_ver < MBEDTLS_SSL_MINOR_VERSION_3 )
        {
            pk_alg = mbedtls_ssl_get_ciphersuite_sig_pk_alg( ciphersuite_info );

            /* Default hash for ECDSA is SHA-1 */
            if( pk_alg == MBEDTLS_PK_ECDSA && md_alg == MBEDTLS_MD_NONE )
                md_alg = MBEDTLS_MD_SHA1;
        }
        else
#endif
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
            return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
        }

        /*
         * Read signature
         */
        sig_len = ( p[0] << 8 ) | p[1];
        p += 2;

        if( end != p + sig_len )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server key exchange message" ) );
            return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_KEY_EXCHANGE );
        }

        MBEDTLS_SSL_DEBUG_BUF( 3, "signature", p, sig_len );

        /*
         * Compute the hash that has been signed
         */
#if defined(MBEDTLS_SSL_PROTO_SSL3) || defined(MBEDTLS_SSL_PROTO_TLS1) || \
    defined(MBEDTLS_SSL_PROTO_TLS1_1)
        if( md_alg == MBEDTLS_MD_NONE )
        {
            mbedtls_md5_context mbedtls_md5;
            mbedtls_sha1_context mbedtls_sha1;

            mbedtls_md5_init(  &mbedtls_md5  );
            mbedtls_sha1_init( &mbedtls_sha1 );

            hashlen = 36;

            /*
             * digitally-signed struct {
             *     opaque md5_hash[16];
             *     opaque sha_hash[20];
             * };
             *
             * md5_hash
             *     MD5(ClientHello.random + ServerHello.random
             *                            + ServerParams);
             * sha_hash
             *     SHA(ClientHello.random + ServerHello.random
             *                            + ServerParams);
             */
            mbedtls_md5_starts( &mbedtls_md5 );
            mbedtls_md5_update( &mbedtls_md5, ssl->handshake->randbytes, 64 );
            mbedtls_md5_update( &mbedtls_md5, params, params_len );
            mbedtls_md5_finish( &mbedtls_md5, hash );

            mbedtls_sha1_starts( &mbedtls_sha1 );
            mbedtls_sha1_update( &mbedtls_sha1, ssl->handshake->randbytes, 64 );
            mbedtls_sha1_update( &mbedtls_sha1, params, params_len );
            mbedtls_sha1_finish( &mbedtls_sha1, hash + 16 );

            mbedtls_md5_free(  &mbedtls_md5  );
            mbedtls_sha1_free( &mbedtls_sha1 );
        }
        else
#endif /* MBEDTLS_SSL_PROTO_SSL3 || MBEDTLS_SSL_PROTO_TLS1 || \
          MBEDTLS_SSL_PROTO_TLS1_1 */
#if defined(MBEDTLS_SSL_PROTO_TLS1) || defined(MBEDTLS_SSL_PROTO_TLS1_1) || \
    defined(MBEDTLS_SSL_PROTO_TLS1_2)
        if( md_alg != MBEDTLS_MD_NONE )
        {
            mbedtls_md_context_t ctx;

            mbedtls_md_init( &ctx );

            /* Info from md_alg will be used instead */
            hashlen = 0;

            /*
             * digitally-signed struct {
             *     opaque client_random[32];
             *     opaque server_random[32];
             *     ServerDHParams params;
             * };
             */
            if( ( ret = mbedtls_md_setup( &ctx,
                                     mbedtls_md_info_from_type( md_alg ), 0 ) ) != 0 )
            {
                MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_md_setup", ret );
                return( ret );
            }

            mbedtls_md_starts( &ctx );
            mbedtls_md_update( &ctx, ssl->handshake->randbytes, 64 );
            mbedtls_md_update( &ctx, params, params_len );
            mbedtls_md_finish( &ctx, hash );
            mbedtls_md_free( &ctx );
        }
        else
#endif /* MBEDTLS_SSL_PROTO_TLS1 || MBEDTLS_SSL_PROTO_TLS1_1 || \
          MBEDTLS_SSL_PROTO_TLS1_2 */
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
            return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
        }

        MBEDTLS_SSL_DEBUG_BUF( 3, "parameters hash", hash, hashlen != 0 ? hashlen :
            (unsigned int) ( mbedtls_md_get_size( mbedtls_md_info_from_type( md_alg ) ) ) );

        if( ssl->session_negotiate->peer_cert == NULL )
        {
            MBEDTLS_SSL_DEBUG_MSG( 2, ( "certificate required" ) );
            return( MBEDTLS_ERR_SSL_UNEXPECTED_MESSAGE );
        }

        /*
         * Verify signature
         */
        if( ! mbedtls_pk_can_do( &ssl->session_negotiate->peer_cert->pk, pk_alg ) )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server key exchange message" ) );
            return( MBEDTLS_ERR_SSL_PK_TYPE_MISMATCH );
        }

        if( ( ret = mbedtls_pk_verify( &ssl->session_negotiate->peer_cert->pk,
                               md_alg, hash, hashlen, p, sig_len ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_pk_verify", ret );
            return( ret );
        }
    }
#endif /* MBEDTLS_KEY_EXCHANGE_DHE_RSA_ENABLED ||
          MBEDTLS_KEY_EXCHANGE_ECDHE_RSA_ENABLED ||
          MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA_ENABLED */

exit:
    ssl->state++;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= parse server key exchange" ) );

    return( 0 );
}